

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LaneBasedExecutionQueue.cpp
# Opt level: O0

QueueJob * __thiscall
anon_unknown.dwarf_1af079::PriorityQueueScheduler::getNextJob
          (QueueJob *__return_storage_ptr__,PriorityQueueScheduler *this)

{
  const_reference pvVar1;
  PriorityQueueScheduler *this_local;
  QueueJob *job;
  
  pvVar1 = std::
           priority_queue<llbuild::basic::QueueJob,_std::vector<llbuild::basic::QueueJob,_std::allocator<llbuild::basic::QueueJob>_>,_QueueJobLess>
           ::top(&this->jobs);
  llbuild::basic::QueueJob::QueueJob(__return_storage_ptr__,pvVar1);
  std::
  priority_queue<llbuild::basic::QueueJob,_std::vector<llbuild::basic::QueueJob,_std::allocator<llbuild::basic::QueueJob>_>,_QueueJobLess>
  ::pop(&this->jobs);
  return __return_storage_ptr__;
}

Assistant:

QueueJob getNextJob() override {
    QueueJob job = jobs.top();
    jobs.pop();
    return job;
  }